

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

_Bool pathmatch(char *cookie_path,char *request_uri)

{
  int iVar1;
  size_t __n;
  char *pcVar2;
  size_t sVar3;
  _Bool ret;
  char *pos;
  char *uri_path;
  size_t uri_path_len;
  size_t cookie_path_len;
  char *request_uri_local;
  char *cookie_path_local;
  
  __n = strlen(cookie_path);
  if (__n == 1) {
    cookie_path_local._7_1_ = true;
  }
  else {
    pos = (*Curl_cstrdup)(request_uri);
    if (pos == (char *)0x0) {
      cookie_path_local._7_1_ = false;
    }
    else {
      pcVar2 = strchr(pos,0x3f);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '\0';
      }
      sVar3 = strlen(pos);
      if ((sVar3 == 0) || (*pos != '/')) {
        (*Curl_cfree)(pos);
        pos = (*Curl_cstrdup)("/");
        if (pos == (char *)0x0) {
          return false;
        }
      }
      sVar3 = strlen(pos);
      if (sVar3 < __n) {
        cookie_path_local._7_1_ = false;
      }
      else {
        iVar1 = strncmp(cookie_path,pos,__n);
        if (iVar1 == 0) {
          if (__n == sVar3) {
            cookie_path_local._7_1_ = true;
          }
          else if (pos[__n] == '/') {
            cookie_path_local._7_1_ = true;
          }
          else {
            cookie_path_local._7_1_ = false;
          }
        }
        else {
          cookie_path_local._7_1_ = false;
        }
      }
      (*Curl_cfree)(pos);
    }
  }
  return cookie_path_local._7_1_;
}

Assistant:

static bool pathmatch(const char *cookie_path, const char *request_uri)
{
  size_t cookie_path_len;
  size_t uri_path_len;
  char *uri_path = NULL;
  char *pos;
  bool ret = FALSE;

  /* cookie_path must not have last '/' separator. ex: /sample */
  cookie_path_len = strlen(cookie_path);
  if(1 == cookie_path_len) {
    /* cookie_path must be '/' */
    return TRUE;
  }

  uri_path = strdup(request_uri);
  if(!uri_path)
    return FALSE;
  pos = strchr(uri_path, '?');
  if(pos)
    *pos = 0x0;

  /* #-fragments are already cut off! */
  if(0 == strlen(uri_path) || uri_path[0] != '/') {
    free(uri_path);
    uri_path = strdup("/");
    if(!uri_path)
      return FALSE;
  }

  /* here, RFC6265 5.1.4 says
     4. Output the characters of the uri-path from the first character up
        to, but not including, the right-most %x2F ("/").
     but URL path /hoge?fuga=xxx means /hoge/index.cgi?fuga=xxx in some site
     without redirect.
     Ignore this algorithm because /hoge is uri path for this case
     (uri path is not /).
   */

  uri_path_len = strlen(uri_path);

  if(uri_path_len < cookie_path_len) {
    ret = FALSE;
    goto pathmatched;
  }

  /* not using checkprefix() because matching should be case-sensitive */
  if(strncmp(cookie_path, uri_path, cookie_path_len)) {
    ret = FALSE;
    goto pathmatched;
  }

  /* The cookie-path and the uri-path are identical. */
  if(cookie_path_len == uri_path_len) {
    ret = TRUE;
    goto pathmatched;
  }

  /* here, cookie_path_len < uri_path_len */
  if(uri_path[cookie_path_len] == '/') {
    ret = TRUE;
    goto pathmatched;
  }

  ret = FALSE;

pathmatched:
  free(uri_path);
  return ret;
}